

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluatePerseusPolicy.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  DecPOMDPDiscreteInterface *pDVar2;
  ostream *poVar3;
  NullPlanner *this;
  QAV<PerseusBGPlanner> *this_00;
  ulong uVar4;
  AgentBG *this_01;
  QAV<PerseusPOMDPPlanner> *this_02;
  AgentPOMDP *this_03;
  StateDistribution *pSVar5;
  ulong uVar6;
  undefined8 *puVar7;
  ulong uVar8;
  PlanningUnitMADPDiscreteParameters local_521 [7];
  undefined1 local_51a;
  undefined1 local_519;
  QAVParameters local_518;
  vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_> agents
  ;
  double local_4c0;
  AgentDelayedSharedObservations *agent1;
  SimulationResult result;
  SimulationDecPOMDPDiscrete sim;
  QAVParameters qavParams;
  Arguments args;
  stringstream valueFunction;
  ostream local_1a8 [376];
  
  ArgumentHandlers::Arguments::Arguments(&args);
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,&args);
  Perseus::ProcessArguments((Arguments *)&qavParams);
  args.cache_flat_models = true;
  pDVar2 = (DecPOMDPDiscreteInterface *)ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&args);
  std::__cxx11::stringstream::stringstream((stringstream *)&valueFunction);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"POMDP",(allocator<char> *)&agents);
  directories::MADPGetResultsFilename
            ((string *)&sim,(MultiAgentDecisionProcessInterface *)&result,
             (Arguments *)(pDVar2 + *(long *)(*(long *)pDVar2 + -0x40)));
  poVar3 = std::operator<<(local_1a8,(string *)&sim);
  poVar3 = std::operator<<(poVar3,"Perseus");
  Perseus::BackupTypeToString_abi_cxx11_(&local_518);
  poVar3 = std::operator<<(poVar3,(string *)&local_518);
  std::operator<<(poVar3,"ValueFunction_h");
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&sim);
  std::__cxx11::string::~string((string *)&result);
  if (args.infiniteHorizon == true) {
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  }
  else {
    std::ostream::operator<<(local_1a8,args.horizon);
  }
  uVar8 = 999999;
  if (args.infiniteHorizon == false) {
    uVar8 = (long)args.horizon;
  }
  PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(local_521);
  PlanningUnitMADPDiscreteParameters::SetComputeAll((bool)((char)&local_519 + -8));
  local_51a = args.sparse != 0;
  local_519 = (**(code **)(*(long *)(pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8)) + 0x140))
                        (pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8));
  this = (NullPlanner *)operator_new(0x338);
  NullPlanner::NullPlanner(this,uVar8,pDVar2,local_521);
  SimulationDecPOMDPDiscrete::SimulationDecPOMDPDiscrete
            (&sim,(PlanningUnitDecPOMDPDiscrete *)this,&args);
  SimulationResult::SimulationResult(&result);
  if (args.backup == POMDP) {
    agents.
    super__Vector_base<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    agents.
    super__Vector_base<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    agents.
    super__Vector_base<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_02 = (QAV<PerseusPOMDPPlanner> *)operator_new(0x38);
    std::__cxx11::stringbuf::str();
    QAV<PerseusPOMDPPlanner>::QAV(this_02,(PlanningUnitDecPOMDPDiscrete *)this,(string *)&local_518)
    ;
    std::__cxx11::string::~string((string *)&local_518);
    uVar6 = 0;
    while( true ) {
      uVar4 = (**(code **)(*(long *)(pDVar2 + *(long *)(*(long *)pDVar2 + -0x40)) + 0x10))
                        (pDVar2 + *(long *)(*(long *)pDVar2 + -0x40));
      if (uVar4 == uVar6) break;
      this_03 = (AgentPOMDP *)operator_new(0x38);
      AgentPOMDP::AgentPOMDP(this_03,(PlanningUnitDecPOMDPDiscrete *)this,0,(QAV *)this_02);
      agent1 = (AgentDelayedSharedObservations *)this_03;
      (**(code **)(*(long *)this_03 + 0x18))(this_03,uVar6);
      std::vector<AgentSharedObservations_*,_std::allocator<AgentSharedObservations_*>_>::push_back
                ((vector<AgentSharedObservations_*,_std::allocator<AgentSharedObservations_*>_> *)
                 &agents,(value_type *)&agent1);
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    SimulationDecPOMDPDiscrete::RunSimulations<AgentSharedObservations>
              ((SimulationDecPOMDPDiscrete *)&local_518,
               (vector<AgentSharedObservations_*,_std::allocator<AgentSharedObservations_*>_> *)&sim
              );
    SimulationResult::operator=(&result,(SimulationResult *)&local_518);
    SimulationResult::~SimulationResult((SimulationResult *)&local_518);
    std::_Vector_base<AgentSharedObservations_*,_std::allocator<AgentSharedObservations_*>_>::
    ~_Vector_base((_Vector_base<AgentSharedObservations_*,_std::allocator<AgentSharedObservations_*>_>
                   *)&agents);
  }
  else {
    if (args.backup != BG) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar7 = "PerseusBackupType is unknown";
      __cxa_throw(puVar7,&char_const*::typeinfo,0);
    }
    agents.
    super__Vector_base<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    agents.
    super__Vector_base<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    agents.
    super__Vector_base<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_00 = (QAV<PerseusBGPlanner> *)operator_new(0x38);
    std::__cxx11::stringbuf::str();
    QAV<PerseusBGPlanner>::QAV(this_00,(PlanningUnitDecPOMDPDiscrete *)this,(string *)&local_518);
    std::__cxx11::string::~string((string *)&local_518);
    uVar6 = 0;
    while( true ) {
      uVar4 = (**(code **)(*(long *)(pDVar2 + *(long *)(*(long *)pDVar2 + -0x40)) + 0x10))
                        (pDVar2 + *(long *)(*(long *)pDVar2 + -0x40));
      if (uVar4 == uVar6) break;
      this_01 = (AgentBG *)operator_new(0x100);
      AgentBG::AgentBG(this_01,(PlanningUnitDecPOMDPDiscrete *)this,0,(QAV *)this_00);
      agent1 = (AgentDelayedSharedObservations *)this_01;
      (**(code **)(*(long *)this_01 + 0x18))(this_01,uVar6);
      std::
      vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>::
      push_back(&agents,&agent1);
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    SimulationDecPOMDPDiscrete::RunSimulations<AgentDelayedSharedObservations>
              ((SimulationDecPOMDPDiscrete *)&local_518,
               (vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
                *)&sim);
    SimulationResult::operator=(&result,(SimulationResult *)&local_518);
    SimulationResult::~SimulationResult((SimulationResult *)&local_518);
    std::
    _Vector_base<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
    ::~_Vector_base(&agents.
                     super__Vector_base<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
                   );
  }
  if (qavParams.stationary == true) {
    pSVar5 = (StateDistribution *)
             (**(code **)(*(long *)(pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8)) + 0x50))
                       (pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8));
    JointBelief::JointBelief((JointBelief *)&local_518,pSVar5);
    lVar1 = *(long *)((long)local_518.waitPenalty + -0xb8);
    std::__cxx11::stringbuf::str();
    AlphaVectorPlanning::ImportValueFunction((string *)&agent1);
    local_4c0 = (double)BeliefValue::GetValue
                                  ((BeliefInterface *)((long)&local_518.waitPenalty + lVar1),
                                   (vector *)&agent1);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)&agent1);
  }
  else {
    pSVar5 = (StateDistribution *)
             (**(code **)(*(long *)(pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8)) + 0x50))
                       (pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8));
    JointBelief::JointBelief((JointBelief *)&local_518,pSVar5);
    lVar1 = *(long *)((long)local_518.waitPenalty + -0xb8);
    std::__cxx11::stringbuf::str();
    uVar6 = (**(code **)(*(long *)(pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8)) + 0x68))
                      (pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8));
    (**(code **)(*(long *)(pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8)) + 0x30))
              (pDVar2 + *(long *)(*(long *)pDVar2 + -0xb8));
    AlphaVectorPlanning::ImportValueFunction((string *)&agent1,(ulong)&agents,uVar8,uVar6);
    local_4c0 = (double)BeliefValue::GetValue
                                  ((BeliefInterface *)((long)&local_518.waitPenalty + lVar1),
                                   (vector *)&agent1,0);
    std::
    vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
    ::~vector((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
               *)&agent1);
  }
  std::__cxx11::string::~string((string *)&agents);
  JointBelief::~JointBelief((JointBelief *)&local_518);
  if (args.verbose < 0) {
    poVar3 = std::ostream::_M_insert<double>(_result);
    std::operator<<(poVar3," ");
    poVar3 = std::ostream::_M_insert<double>(local_4c0);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Empirical control quality (h ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," backup ");
    Perseus::BackupTypeToString_abi_cxx11_(&local_518);
    poVar3 = std::operator<<(poVar3,(string *)&local_518);
    std::operator<<(poVar3," V(jb0) ");
    poVar3 = std::ostream::_M_insert<double>(local_4c0);
    std::operator<<(poVar3,") = ");
    poVar3 = std::ostream::_M_insert<double>(_result);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_518);
  }
  SimulationResult::~SimulationResult(&result);
  SimulationDecPOMDPDiscrete::~SimulationDecPOMDPDiscrete(&sim);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(local_521);
  std::__cxx11::stringstream::~stringstream((stringstream *)&valueFunction);
  std::__cxx11::string::~string((string *)&args.maxplus_updateT);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    try {

    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    QAVParameters qavParams=Perseus::ProcessArguments(args);

    // this is necessary for running Perseus on TOI models
    args.cache_flat_models=true;

    DecPOMDPDiscreteInterface* decpomdp;
    decpomdp = GetDecPOMDPDiscreteInterfaceFromArgs(args);

    stringstream valueFunction;
    valueFunction << directories::MADPGetResultsFilename("POMDP",*decpomdp,args)
                  << "Perseus"
                  << Perseus::BackupTypeToString(qavParams) 
                  << "ValueFunction_h";
    if(args.infiniteHorizon)
        valueFunction << MAXHORIZON;
    else
        valueFunction << args.horizon;

    size_t horizon;
    if(!args.infiniteHorizon)
    {
        horizon=args.horizon;
//         if(qavParams.stationary && !args.isTOI)
//             decpomdp->ConvertFiniteToInfiniteHorizon(horizon);
    }
    else
        horizon=MAXHORIZON;
   

    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(false);
    if(args.sparse)
        params.SetUseSparseJointBeliefs(true);
    else
        params.SetUseSparseJointBeliefs(false);

    params.SetEventObservability(decpomdp->GetEventObservability());

    PlanningUnitDecPOMDPDiscrete *np=new NullPlanner(horizon,decpomdp, &params);

    SimulationDecPOMDPDiscrete sim(*np,args);
    SimulationResult result;

    switch(args.backup)
    {
    case POMDP:
    {
        vector<AgentSharedObservations*> agents;
        AgentSharedObservations *agent1;
        QAV<PerseusPOMDPPlanner> *Qpomdp=
            new QAV<PerseusPOMDPPlanner>(np,valueFunction.str());
        for(unsigned int i=0;i!=decpomdp->GetNrAgents();++i)
        {
            agent1=new AgentPOMDP(np,0,Qpomdp);
            agent1->SetIndex(i);
            agents.push_back(agent1);
        }
        result=sim.RunSimulations(agents);
        break;
    }
    case BG:
    {
        vector<AgentDelayedSharedObservations*> agents;
        QAV<PerseusBGPlanner> *Qbg=
            new QAV<PerseusBGPlanner>(np,valueFunction.str());
        AgentDelayedSharedObservations *agent1;
        for(unsigned int i=0;i!=decpomdp->GetNrAgents();++i)
        {
            agent1=new AgentBG(np,0,Qbg);
            agent1->SetIndex(i);
            agents.push_back(agent1);
        }
        result=sim.RunSimulations(agents);
        break;
    }
    default:
        throw("PerseusBackupType is unknown");
    }

    double Vjb0;
    if(qavParams.stationary)
        Vjb0=
            BeliefValue::GetValue(JointBelief(*decpomdp->GetISD()),
                                  AlphaVectorPlanning::
                                  ImportValueFunction(valueFunction.str()));
    else
    {
        Vjb0=
            BeliefValue::GetValue(JointBelief(*decpomdp->GetISD()),
                                  AlphaVectorPlanning::
                                  ImportValueFunction(valueFunction.str(),
                                                      horizon, decpomdp->
                                                      GetNrJointActions(),
                                                      decpomdp->
                                                      GetNrStates()),
                                  0);
    }
    if(args.verbose < 0)
        cout << result.GetAvgReward() << " " << Vjb0 << endl;
    else
    {
        cout << "Empirical control quality (h " << horizon << " backup "
             << Perseus::BackupTypeToString(qavParams)
             << " V(jb0) " << Vjb0 << ") = " << result.GetAvgReward() << endl;
    }

    }
    catch(E& e){ e.Print(); }

    return(0);
}